

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::DepthBiasBaseCase
          (DepthBiasBaseCase *this,Context *context,char *vertexShaderName,char *fragmentShaderName)

{
  StencilOpState _front;
  StencilOpState _back;
  char *pcVar1;
  DeviceInterface *pDVar2;
  VkStencilOpState local_78;
  VkStencilOpState local_58;
  allocator<char> local_36;
  allocator<char> local_35 [13];
  char *local_28;
  char *fragmentShaderName_local;
  char *vertexShaderName_local;
  Context *context_local;
  DepthBiasBaseCase *this_local;
  
  local_28 = fragmentShaderName;
  fragmentShaderName_local = vertexShaderName;
  vertexShaderName_local = (char *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DepthBiasBaseCase_01668e20;
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  pDVar2 = Context::getDeviceInterface((Context *)vertexShaderName_local);
  this->m_vk = pDVar2;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  de::SharedPtr<vkt::Draw::Image>::SharedPtr(&this->m_colorTargetImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_colorTargetView);
  de::SharedPtr<vkt::Draw::Image>::SharedPtr(&this->m_depthStencilImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_attachmentView);
  Draw::PipelineCreateInfo::VertexInputState::VertexInputState
            (&this->m_vertexInputState,0,(VkVertexInputBindingDescription *)0x0,0,
             (VkVertexInputAttributeDescription *)0x0);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&this->m_vertexBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_cmdPool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&this->m_cmdBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  pcVar1 = fragmentShaderName_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_vertexShaderName,pcVar1,local_35);
  std::allocator<char>::~allocator(local_35);
  pcVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentShaderName,pcVar1,&local_36);
  std::allocator<char>::~allocator(&local_36);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::vector(&this->m_data);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_58,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_78,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_58.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_58.failOp;
  _front.super_VkStencilOpState.passOp = local_58.passOp;
  _front.super_VkStencilOpState.compareOp = local_58.compareOp;
  _front.super_VkStencilOpState.compareMask = local_58.compareMask;
  _front.super_VkStencilOpState.writeMask = local_58.writeMask;
  _front.super_VkStencilOpState.reference = local_58.reference;
  _back.super_VkStencilOpState.depthFailOp = local_78.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_78.failOp;
  _back.super_VkStencilOpState.passOp = local_78.passOp;
  _back.super_VkStencilOpState.compareOp = local_78.compareOp;
  _back.super_VkStencilOpState.compareMask = local_78.compareMask;
  _back.super_VkStencilOpState.writeMask = local_78.writeMask;
  _back.super_VkStencilOpState.reference = local_78.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            (&this->m_depthStencilState,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  return;
}

Assistant:

DepthBiasBaseCase (Context& context, const char* vertexShaderName, const char* fragmentShaderName)
		: TestInstance						(context)
		, m_colorAttachmentFormat			(vk::VK_FORMAT_R8G8B8A8_UNORM)
		, m_topology						(vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)
		, m_vk								(context.getDeviceInterface())
		, m_vertexShaderName				(vertexShaderName)
		, m_fragmentShaderName				(fragmentShaderName)
	{
	}